

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::Image>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  char *pcVar1;
  GetPastPresentationTimingGOOGLEFunc vkp_;
  undefined8 programBinaries_;
  bool bVar2;
  deUint32 dVar3;
  VkAllocationCallbacks *pVVar4;
  PlatformInterface *pPVar5;
  DeviceInterface *pDVar6;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries__00;
  TestContext *pTVar7;
  CommandLine *this;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  deUint32 local_d30;
  allocator<char> local_ce1;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  allocator<char> local_c91;
  string local_c90;
  allocator<char> local_c69;
  string local_c68;
  MessageBuilder local_c48;
  allocator<char> local_ac1;
  string local_ac0;
  int local_aa0;
  OutOfMemoryError *e;
  RefData<vk::Handle<(vk::HandleType)9>_> local_a50;
  undefined1 local_a30 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> obj;
  MessageBuilder local_a08;
  byte local_881;
  undefined1 local_880 [7];
  bool createOk;
  Environment objEnv;
  AllocationCallbackRecorder recorder;
  DeterministicFailAllocator objAllocator;
  undefined8 uStack_790;
  Resources res;
  undefined1 local_788 [8];
  EnvClone resEnv;
  deUint32 maxTries;
  deUint32 cmdLineIterCount;
  deUint32 numPassingAllocs;
  undefined1 local_b0 [8];
  Environment rootEnv;
  AllocationCallbackRecorder resCallbacks;
  Context *context_local;
  
  pVVar4 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,pVVar4,0x80);
  pPVar5 = Context::getPlatformInterface(context);
  pDVar6 = Context::getDeviceInterface(context);
  device_ = Context::getDevice(context);
  dVar3 = Context::getUniversalQueueFamilyIndex(context);
  programBinaries__00 = Context::getBinaryCollection(context);
  pVVar4 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&rootEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)local_b0,pPVar5,pDVar6,device_,dVar3,programBinaries__00,pVVar4,1);
  maxTries = 0;
  pTVar7 = Context::getTestContext(context);
  this = tcu::TestContext::getCommandLine(pTVar7);
  local_d30 = tcu::CommandLine::getTestIterationCount(this);
  resEnv.env._52_4_ = local_d30;
  if (local_d30 == 0) {
    local_d30 = getOomIterLimit<vkt::api::(anonymous_namespace)::Image>();
  }
  resEnv.env.maxResourceConsumers = local_d30;
  uStack_790 = getDefaulDeviceParameters(context);
  EnvClone::EnvClone((EnvClone *)local_788,(Environment *)local_b0,
                     (Parameters *)&stack0xfffffffffffff870,1);
  Image::Resources::Resources
            ((Resources *)&objAllocator.field_0x4f,
             (Environment *)&resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,&params);
  do {
    if (resEnv.env.maxResourceConsumers <= maxTries) {
LAB_007c1028:
      local_aa0 = 0;
LAB_007c1032:
      EnvClone::~EnvClone((EnvClone *)local_788);
      if (local_aa0 == 0) {
        pTVar7 = Context::getTestContext(context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        bVar2 = ::vk::validateAndLog
                          (pTVar8,(AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,0);
        if (bVar2) {
          if (maxTries == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c90,"Allocation callbacks not called",&local_c91);
            tcu::TestStatus::TestStatus
                      (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_c90);
            std::__cxx11::string::~string((string *)&local_c90);
            std::allocator<char>::~allocator(&local_c91);
            local_aa0 = 1;
          }
          else if (maxTries == resEnv.env.maxResourceConsumers) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_cb8,"Max iter count reached; OOM testing incomplete",
                       &local_cb9);
            tcu::TestStatus::TestStatus
                      (__return_storage_ptr__,QP_TEST_RESULT_COMPATIBILITY_WARNING,&local_cb8);
            std::__cxx11::string::~string((string *)&local_cb8);
            std::allocator<char>::~allocator(&local_cb9);
            local_aa0 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce0,"Ok",&local_ce1)
            ;
            tcu::TestStatus::pass(__return_storage_ptr__,&local_ce0);
            std::__cxx11::string::~string((string *)&local_ce0);
            std::allocator<char>::~allocator(&local_ce1);
            local_aa0 = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c68,"Invalid allocation callback",&local_c69);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_c68);
          std::__cxx11::string::~string((string *)&local_c68);
          std::allocator<char>::~allocator(&local_c69);
          local_aa0 = 1;
        }
      }
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
                ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers);
      return __return_storage_ptr__;
    }
    pVVar4 = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,pVVar4,MODE_COUNT_AND_FAIL,
               maxTries);
    pVVar4 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&recorder.m_records.m_last);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar4,0x80);
    programBinaries_ = resEnv.env._24_8_;
    dVar3 = (deUint32)resEnv.env.device;
    pDVar6 = resEnv.env.vkd;
    pPVar5 = resEnv.env.vkp;
    vkp_ = resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE;
    pVVar4 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
    Environment::Environment
              ((Environment *)local_880,(PlatformInterface *)vkp_,(DeviceInterface *)pPVar5,
               (VkDevice)pDVar6,dVar3,(BinaryCollection *)programBinaries_,pVVar4,
               (deUint32)resEnv.env.allocationCallbacks);
    local_881 = 0;
    pTVar7 = Context::getTestContext(context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_a08,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_a08,(char (*) [30])"Trying to create object with ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&maxTries);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [12])" allocation");
    pcVar1 = ",\n\t\t";
    if (maxTries != 1) {
      pcVar1 = "%s<%s";
    }
    obj.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)(pcVar1 + 4);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char **)&obj.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                                         deleter.m_allocator);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])" passing");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a08);
    Image::create((Move<vk::Handle<(vk::HandleType)9>_> *)&e,(Environment *)local_880,
                  (Resources *)&objAllocator.field_0x4f,&params);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_a50,(Move *)&e);
    data.deleter.m_deviceIface._0_4_ = (int)local_a50.deleter.m_deviceIface;
    data.object.m_internal = local_a50.object.m_internal;
    data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a50.deleter.m_deviceIface >> 0x20);
    data.deleter.m_device = local_a50.deleter.m_device;
    data.deleter.m_allocator = local_a50.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_a30,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)9>_> *)&e);
    local_881 = 1;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_a30);
    pTVar7 = Context::getTestContext(context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    bVar2 = ::vk::validateAndLog
                      (pTVar8,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
    if (bVar2) {
      if ((local_881 & 1) == 0) {
        local_aa0 = 0;
      }
      else {
        pTVar7 = Context::getTestContext(context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<(&local_c48,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_c48,(char (*) [32])"Object construction succeeded! ");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_c48);
        local_aa0 = 2;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ac0,"Invalid allocation callback",&local_ac1);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_ac0);
      std::__cxx11::string::~string((string *)&local_ac0);
      std::allocator<char>::~allocator(&local_ac1);
      local_aa0 = 1;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last);
    if (local_aa0 != 0) {
      if (local_aa0 != 2) goto LAB_007c1032;
      goto LAB_007c1028;
    }
    maxTries = maxTries + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}